

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziparchive.c
# Opt level: O0

void coda_za_close(za_file *zf)

{
  int local_14;
  int i;
  za_file *zf_local;
  
  close(zf->fd);
  if (zf->entry != (za_entry *)0x0) {
    for (local_14 = 0; local_14 < zf->num_entries; local_14 = local_14 + 1) {
      if (zf->entry[local_14].filename != (char *)0x0) {
        free(zf->entry[local_14].filename);
      }
    }
    free(zf->entry);
  }
  if (zf->filename != (char *)0x0) {
    free(zf->filename);
  }
  if (zf->hash_data != (hashtable *)0x0) {
    coda_hashtable_delete(zf->hash_data);
  }
  free(zf);
  return;
}

Assistant:

void za_close(za_file *zf)
{
    close(zf->fd);
    if (zf->entry != NULL)
    {
        int i;

        for (i = 0; i < zf->num_entries; i++)
        {
            if (zf->entry[i].filename != NULL)
            {
                free(zf->entry[i].filename);
            }
        }
        free(zf->entry);
    }
    if (zf->filename != NULL)
    {
        free(zf->filename);
    }
    if (zf->hash_data != NULL)
    {
        hashtable_delete(zf->hash_data);
    }
    free(zf);
}